

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O1

int AF_A_UnSetReflectiveInvulnerable
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  undefined8 uVar5;
  PClass *pPVar6;
  undefined4 in_register_00000014;
  VMValue *pVVar7;
  char *__assertion;
  bool bVar8;
  undefined1 auVar9 [16];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar5 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005dc2c8;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    pVVar7 = param;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        auVar9 = (**(code **)*puVar2)(puVar2);
        uVar5 = auVar9._8_8_;
        puVar2[1] = auVar9._0_8_;
      }
      pPVar6 = (PClass *)puVar2[1];
      bVar8 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar8;
      uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),bVar8);
      pVVar7 = (VMValue *)(ulong)(pPVar6 == pPVar4 || bVar8);
      if (pPVar6 != pPVar4 && !bVar8) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar4) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005dc2c8;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005dc29d;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar5 = (**(code **)*puVar3)(puVar3,pVVar7,uVar5,ret);
          puVar3[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar3[1];
        bVar8 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar8) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar8 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005dc2c8;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      *(byte *)((long)puVar2 + 0x193) = *(byte *)((long)puVar2 + 0x193) & 0x77;
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005dc29d:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005dc2c8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_action.cpp"
                ,0x22b,
                "int AF_A_UnSetReflectiveInvulnerable(VMFrameStack *, VMValue *, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_UnSetReflectiveInvulnerable)
{
	PARAM_ACTION_PROLOGUE;

	self->flags2 &= ~(MF2_REFLECTIVE|MF2_INVULNERABLE);
	return 0;
}